

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::GPUConversionDecodeEnabledCase::setupTest
          (GPUConversionDecodeEnabledCase *this)

{
  char *__s;
  Vec4 local_158;
  Vec4 local_148;
  undefined1 local_138 [8];
  FragmentShaderParameters shaderParameters;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  undefined1 local_58 [8];
  ComparisonFunction comparisonFunction;
  GPUConversionDecodeEnabledCase *this_local;
  
  comparisonFunction.implementation.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_78,"srgbToLinearCheck",&local_79);
  __s = getFunctionDefinitionSRGBToLinearCheck();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_b0,__s,
             (allocator<char> *)
             ((long)&shaderParameters.uniformsToToggle.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  ComparisonFunction::ComparisonFunction
            ((ComparisonFunction *)local_58,&local_78,FUNCTIONPARAMETERS_TWO,&local_b0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&shaderParameters.uniformsToToggle.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)local_138,SHADEROUTPUTS_ONE,SHADERUNIFORMS_TWO,
             (ComparisonFunction *)local_58,BLENDING_NOT_REQUIRED,TOGGLING_NOT_REQUIRED);
  getColorReferenceLinear();
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,TEXTURETYPE_2D,0x80,0x80,&local_148,MIRRORED_REPEAT_GL,
             MIRRORED_REPEAT_GL,LINEAR,LINEAR,SRGBDECODE_SKIP_DECODE);
  getColorReferenceLinear();
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,TEXTURETYPE_2D,0x80,0x80,&local_158,MIRRORED_REPEAT_GL,
             MIRRORED_REPEAT_GL,LINEAR,LINEAR,SRGBDECODE_DECODE_DEFAULT);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_138);
  SRGBTestCase::setSamplingLocations(&this->super_SRGBTestCase,0,0);
  SRGBTestCase::setSamplingGroup(&this->super_SRGBTestCase,SHADERSAMPLINGGROUP_TEXTURE);
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_138);
  ComparisonFunction::~ComparisonFunction((ComparisonFunction *)local_58);
  return;
}

Assistant:

void GPUConversionDecodeEnabledCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT and texture_b to default
	//	- store textures on GPU
	//	- in fragment shader, sample both textures using texture*() and manually perform sRGB to lRGB conversion on texture_b
	//	- in fragment shader, compare converted texture_b with texture_a
	//	- render green image for pass or red for fail

	ComparisonFunction comparisonFunction("srgbToLinearCheck", FUNCTIONPARAMETERS_TWO, getFunctionDefinitionSRGBToLinearCheck());

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_TWO, &comparisonFunction, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE_DEFAULT);

	this->addShaderProgram(shaderParameters);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);

	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}